

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# teglGLES2SharingTests.cpp
# Opt level: O0

void __thiscall deqp::egl::GLES2BufferSharingTest::createResource(GLES2BufferSharingTest *this)

{
  glBufferDataFunc p_Var1;
  int iVar2;
  GLenum GVar3;
  deBool dVar4;
  size_type sVar5;
  reference pvVar6;
  value_type_conflict5 local_19;
  int local_18;
  int local_14;
  int i;
  int size;
  GLES2BufferSharingTest *this_local;
  
  local_14 = 0x400;
  _i = this;
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::reserve(&this->m_buffer,0x400);
  for (local_18 = 0; local_18 < local_14; local_18 = local_18 + 1) {
    iVar2 = de::Random::getInt(&(this->super_GLES2SharingTest).m_random,0,0xff);
    local_19 = (value_type_conflict5)iVar2;
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::push_back(&this->m_buffer,&local_19)
    ;
  }
  do {
    (*(this->super_GLES2SharingTest).m_gl.genBuffers)(1,&this->m_glBuffer);
    GVar3 = (*(this->super_GLES2SharingTest).m_gl.getError)();
    glu::checkError(GVar3,"genBuffers(1, &m_glBuffer)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/egl/teglGLES2SharingTests.cpp"
                    ,0x144);
    dVar4 = ::deGetFalse();
  } while (dVar4 != 0);
  do {
    (*(this->super_GLES2SharingTest).m_gl.bindBuffer)(0x8892,this->m_glBuffer);
    GVar3 = (*(this->super_GLES2SharingTest).m_gl.getError)();
    glu::checkError(GVar3,"bindBuffer(GL_ARRAY_BUFFER, m_glBuffer)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/egl/teglGLES2SharingTests.cpp"
                    ,0x145);
    dVar4 = ::deGetFalse();
  } while (dVar4 != 0);
  do {
    p_Var1 = (this->super_GLES2SharingTest).m_gl.bufferData;
    sVar5 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::size(&this->m_buffer);
    pvVar6 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator[]
                       (&this->m_buffer,0);
    (*p_Var1)(0x8892,(long)(int)sVar5,pvVar6,0x88e8);
    GVar3 = (*(this->super_GLES2SharingTest).m_gl.getError)();
    glu::checkError(GVar3,
                    "bufferData(GL_ARRAY_BUFFER, (GLsizei)(m_buffer.size() * sizeof(GLubyte)), &(m_buffer[0]), GL_DYNAMIC_DRAW)"
                    ,
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/egl/teglGLES2SharingTests.cpp"
                    ,0x146);
    dVar4 = ::deGetFalse();
  } while (dVar4 != 0);
  do {
    (*(this->super_GLES2SharingTest).m_gl.bindBuffer)(0x8892,0);
    GVar3 = (*(this->super_GLES2SharingTest).m_gl.getError)();
    glu::checkError(GVar3,"bindBuffer(GL_ARRAY_BUFFER, 0)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/egl/teglGLES2SharingTests.cpp"
                    ,0x147);
    dVar4 = ::deGetFalse();
  } while (dVar4 != 0);
  return;
}

Assistant:

void GLES2BufferSharingTest::createResource (void)
{
	int						size	= 16*16*4;

	m_buffer.reserve(size);

	for (int i = 0; i < size; i++)
		m_buffer.push_back((GLubyte)m_random.getInt(0, 255));

	GLU_CHECK_GLW_CALL(m_gl, genBuffers(1, &m_glBuffer));
	GLU_CHECK_GLW_CALL(m_gl, bindBuffer(GL_ARRAY_BUFFER, m_glBuffer));
	GLU_CHECK_GLW_CALL(m_gl, bufferData(GL_ARRAY_BUFFER, (GLsizei)(m_buffer.size() * sizeof(GLubyte)), &(m_buffer[0]), GL_DYNAMIC_DRAW));
	GLU_CHECK_GLW_CALL(m_gl, bindBuffer(GL_ARRAY_BUFFER, 0));
}